

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O0

void __thiscall FreqTable::setTotal(FreqTable *this,double csum)

{
  iterator __last;
  iterator __init;
  vector<double,_std::allocator<double>_> *in_RDI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_XMM0_Qa;
  double dVar1;
  
  if (((double)in_XMM0_Qa._M_current != 0.0) || (NAN((double)in_XMM0_Qa._M_current))) {
    *(int *)&in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = (int)(double)in_XMM0_Qa._M_current;
  }
  else {
    __last = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __init = std::vector<double,_std::allocator<double>_>::end(in_RDI);
    dVar1 = std::
            accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                      (in_XMM0_Qa,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                       __last._M_current,(double)__init._M_current);
    *(int *)&in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = (int)dVar1;
  }
  return;
}

Assistant:

void FreqTable::setTotal(double csum=0.0) {
    (static_cast<bool>(csum) ? this -> total = csum : this -> total = accumulate(frequencies.begin(), frequencies.end(), 0.0));
}